

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.hpp
# Opt level: O0

index __thiscall
boost::detail::multi_array::
multi_array_impl_base<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*,2ul>
::
calculate_origin_offset<boost::array<long,2ul>,boost::array<unsigned_long,2ul>,boost::array<long,2ul>>
          (multi_array_impl_base<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
           *this,array<long,_2UL> *stride_list,array<unsigned_long,_2UL> *extent_list,
          general_storage_order<2UL> *storage,array<long,_2UL> *index_base_list)

{
  index iVar1;
  index iVar2;
  array<unsigned_long,_2UL> *in_RCX;
  array<long,_2UL> *in_RDX;
  multi_array_impl_base<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
  *in_RSI;
  general_storage_order<2UL> *in_R8;
  
  iVar1 = calculate_descending_dimension_offset<boost::array<long,2ul>,boost::array<unsigned_long,2ul>>
                    (in_RSI,in_RDX,in_RCX,in_R8);
  iVar2 = calculate_indexing_offset<boost::array<long,2ul>,boost::array<long,2ul>>
                    (in_RSI,in_RDX,(array<long,_2UL> *)in_RCX);
  return iVar1 + iVar2;
}

Assistant:

index
  calculate_origin_offset(const StrideList& stride_list,
                          const ExtentList& extent_list,
                          const general_storage_order<NumDims>& storage,
                          const BaseList& index_base_list)
  {
    return
      calculate_descending_dimension_offset(stride_list,extent_list,
                                            storage) +
      calculate_indexing_offset(stride_list,index_base_list);
  }